

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filesystem.cc
# Opt level: O0

char * __thiscall phosg::basename(phosg *this,char *__filename)

{
  size_type sVar1;
  size_t slash_pos;
  string *filename_local;
  
  sVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::rfind
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__filename
                     ,'/',0xffffffffffffffff);
  if (sVar1 == 0xffffffffffffffff) {
    ::std::__cxx11::string::string
              ((string *)this,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__filename);
  }
  else {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__filename,
               sVar1 + 1,0xffffffffffffffff);
  }
  return (char *)this;
}

Assistant:

std::string basename(const std::string& filename) {
  size_t slash_pos = filename.rfind('/');
  return (slash_pos == string::npos) ? filename : filename.substr(slash_pos + 1);
}